

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O1

void __thiscall
psy::C::Parser::DiagnosticsReporter::diagnoseOrDelayDiagnostic
          (DiagnosticsReporter *this,DiagnosticDescriptor *desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  SyntaxTree *this_00;
  pointer pcVar6;
  bool bVar7;
  key_type *__k;
  iterator iVar8;
  _Alloc_hider _Var9;
  pair<psy::DiagnosticDescriptor,_unsigned_int> local_178;
  undefined1 local_108 [32];
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined2 local_a8;
  pair<psy::DiagnosticDescriptor,_unsigned_long> local_a0;
  
  bVar7 = willBacktrack(this->parser_);
  if (!bVar7) {
    __k = (key_type *)psy::DiagnosticDescriptor::id_abi_cxx11_();
    iVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->IDsForDelay_)._M_h,__k);
    if (iVar8.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = this->parser_->tree_;
      pcVar6 = (desc->id_)._M_dataplus._M_p;
      local_108._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_108 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar6,pcVar6 + (desc->id_)._M_string_length);
      pcVar6 = (desc->title_)._M_dataplus._M_p;
      local_e8._M_p = (pointer)&local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar6,pcVar6 + (desc->title_)._M_string_length);
      pcVar6 = (desc->description_)._M_dataplus._M_p;
      local_c8._M_p = (pointer)&local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar6,pcVar6 + (desc->description_)._M_string_length);
      local_a8._0_1_ = desc->defaultSeverity_;
      local_a8._1_1_ = desc->category_;
      SyntaxTree::newDiagnostic
                (this_00,(DiagnosticDescriptor *)local_108,(ulong)this->parser_->curTkIdx_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      _Var9._M_p = (pointer)local_108._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_108 + 0x10)) {
        return;
      }
    }
    else {
      std::pair<psy::DiagnosticDescriptor,_unsigned_int>::
      pair<psy::DiagnosticDescriptor_&,_unsigned_int_&,_true>
                (&local_178,desc,&this->parser_->curTkIdx_);
      local_a0.first.id_._M_dataplus._M_p = (pointer)&local_a0.first.id_.field_2;
      paVar1 = &local_178.first.id_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.first.id_._M_dataplus._M_p == paVar1) {
        local_a0.first.id_.field_2._8_8_ = local_178.first.id_.field_2._8_8_;
      }
      else {
        local_a0.first.id_._M_dataplus._M_p = local_178.first.id_._M_dataplus._M_p;
      }
      local_a0.first.id_.field_2._M_allocated_capacity._1_7_ =
           local_178.first.id_.field_2._M_allocated_capacity._1_7_;
      local_a0.first.id_.field_2._M_local_buf[0] = local_178.first.id_.field_2._M_local_buf[0];
      paVar2 = &local_178.first.title_.field_2;
      paVar4 = &local_a0.first.title_.field_2;
      local_a0.first.id_._M_string_length = local_178.first.id_._M_string_length;
      local_178.first.id_._M_string_length = 0;
      local_178.first.id_.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.first.title_._M_dataplus._M_p == paVar2) {
        local_a0.first.title_.field_2._8_8_ = local_178.first.title_.field_2._8_8_;
        local_a0.first.title_._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_a0.first.title_._M_dataplus._M_p = local_178.first.title_._M_dataplus._M_p;
      }
      local_a0.first.title_.field_2._M_allocated_capacity._1_7_ =
           local_178.first.title_.field_2._M_allocated_capacity._1_7_;
      local_a0.first.title_.field_2._M_local_buf[0] = local_178.first.title_.field_2._M_local_buf[0]
      ;
      paVar3 = &local_178.first.description_.field_2;
      paVar5 = &local_a0.first.description_.field_2;
      local_a0.first.title_._M_string_length = local_178.first.title_._M_string_length;
      local_178.first.title_._M_string_length = 0;
      local_178.first.title_.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.first.description_._M_dataplus._M_p == paVar3) {
        local_a0.first.description_.field_2._8_8_ = local_178.first.description_.field_2._8_8_;
        local_a0.first.description_._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_a0.first.description_._M_dataplus._M_p = local_178.first.description_._M_dataplus._M_p
        ;
      }
      local_a0.first.description_.field_2._M_allocated_capacity._1_7_ =
           local_178.first.description_.field_2._M_allocated_capacity._1_7_;
      local_a0.first.description_.field_2._M_local_buf[0] =
           local_178.first.description_.field_2._M_local_buf[0];
      local_a0.first.description_._M_string_length = local_178.first.description_._M_string_length;
      local_178.first.description_._M_string_length = 0;
      local_178.first.description_.field_2._M_local_buf[0] = '\0';
      local_a0.first.defaultSeverity_ = local_178.first.defaultSeverity_;
      local_a0.first.category_ = local_178.first.category_;
      local_a0.second = (unsigned_long)local_178.second;
      local_178.first.id_._M_dataplus._M_p = (pointer)paVar1;
      local_178.first.title_._M_dataplus._M_p = (pointer)paVar2;
      local_178.first.description_._M_dataplus._M_p = (pointer)paVar3;
      std::
      vector<std::pair<psy::DiagnosticDescriptor,unsigned_long>,std::allocator<std::pair<psy::DiagnosticDescriptor,unsigned_long>>>
      ::emplace_back<std::pair<psy::DiagnosticDescriptor,unsigned_long>>
                ((vector<std::pair<psy::DiagnosticDescriptor,unsigned_long>,std::allocator<std::pair<psy::DiagnosticDescriptor,unsigned_long>>>
                  *)&this->delayedDiags_,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first.description_._M_dataplus._M_p != paVar5) {
        operator_delete(local_a0.first.description_._M_dataplus._M_p,
                        local_a0.first.description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first.title_._M_dataplus._M_p != paVar4) {
        operator_delete(local_a0.first.title_._M_dataplus._M_p,
                        local_a0.first.title_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first.id_._M_dataplus._M_p != &local_a0.first.id_.field_2) {
        operator_delete(local_a0.first.id_._M_dataplus._M_p,
                        local_a0.first.id_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.first.description_._M_dataplus._M_p != paVar3) {
        operator_delete(local_178.first.description_._M_dataplus._M_p,
                        CONCAT71(local_178.first.description_.field_2._M_allocated_capacity._1_7_,
                                 local_178.first.description_.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.first.title_._M_dataplus._M_p != paVar2) {
        operator_delete(local_178.first.title_._M_dataplus._M_p,
                        CONCAT71(local_178.first.title_.field_2._M_allocated_capacity._1_7_,
                                 local_178.first.title_.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.first.id_._M_dataplus._M_p == paVar1) {
        return;
      }
      local_108._16_8_ =
           CONCAT71(local_178.first.id_.field_2._M_allocated_capacity._1_7_,
                    local_178.first.id_.field_2._M_local_buf[0]);
      _Var9._M_p = local_178.first.id_._M_dataplus._M_p;
    }
    operator_delete(_Var9._M_p,local_108._16_8_ + 1);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::diagnoseOrDelayDiagnostic(DiagnosticDescriptor&& desc)
{
    if (parser_->willBacktrack())
        return;

    if (IDsForDelay_.find(desc.id()) != IDsForDelay_.end())
        delayedDiags_.push_back(std::make_pair(desc, parser_->curTkIdx_));
    else
        parser_->tree_->newDiagnostic(desc, parser_->curTkIdx_);
}